

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O2

vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> * __thiscall
sc_core::sc_vector_base::get_elements(sc_vector_base *this)

{
  int iVar1;
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *this_00;
  undefined4 extraout_var;
  pointer ppsVar2;
  long lVar3;
  pointer ppsVar4;
  sc_object *obj;
  
  this_00 = this->objs_vec_;
  if (this_00 == (vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)0x0) {
    this_00 = (vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)
              operator_new(0x18);
    (this_00->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this->objs_vec_ = this_00;
    ppsVar2 = (pointer)0x0;
  }
  else {
    ppsVar2 = (this_00->
              super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (((this_00->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
       _M_impl.super__Vector_impl_data._M_finish == ppsVar2) &&
     (lVar3 = (long)(this->vec_).
                    super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vec_).
                    super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar3 != 0)) {
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::reserve
              (this_00,lVar3 >> 3);
    for (ppsVar4 = (this->vec_).
                   super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppsVar4 !=
        (this->vec_).
        super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppsVar4 = ppsVar4 + 1) {
      iVar1 = (*(this->super_sc_object)._vptr_sc_object[0xf])(this,*ppsVar4);
      obj = (sc_object *)CONCAT44(extraout_var,iVar1);
      if (obj != (sc_object *)0x0) {
        std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::push_back
                  (this->objs_vec_,&obj);
      }
    }
    this_00 = this->objs_vec_;
  }
  return this_00;
}

Assistant:

std::vector< sc_object* > const &
sc_vector_base::get_elements() const
{
  if( !objs_vec_ )
    objs_vec_ = new std::vector< sc_object* >;

  if( objs_vec_->size() || !size() )
    return *objs_vec_;

  objs_vec_->reserve( size() );
  for( const_iterator it=begin(); it != end(); ++it )
    if( sc_object* obj = object_cast(*it) )
      objs_vec_->push_back( obj );

  return *objs_vec_;
}